

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Swish_x86_fma::forward_inplace(Swish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  ulong uVar12;
  undefined1 auVar20 [32];
  undefined1 auVar13 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar16 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar26 [16];
  undefined1 extraout_var [60];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar35 [16];
  undefined1 auVar40 [36];
  undefined1 auVar39 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar41 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 local_128 [16];
  float local_d8;
  undefined1 auVar19 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    auVar57 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    lVar10 = 0;
    do {
      auVar63._8_4_ = 0x39506967;
      auVar63._0_8_ = 0x3950696739506967;
      auVar60._8_4_ = 0x3c088908;
      auVar60._0_8_ = 0x3c0889083c088908;
      auVar59._8_4_ = 0x3fb8aa3b;
      auVar59._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar55._8_4_ = 0x3f000000;
      auVar55._0_8_ = 0x3f0000003f000000;
      auVar45._8_4_ = 0xc2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._8_4_ = 0x42b0c0a5;
      auVar36._0_8_ = 0x42b0c0a542b0c0a5;
      auVar30._8_4_ = 0x3ab743ce;
      auVar30._0_8_ = 0x3ab743ce3ab743ce;
      auVar16._8_4_ = 0x395e8083;
      auVar16._0_8_ = 0x395e8083395e8083;
      auVar63._12_4_ = 0x39506967;
      auVar60._12_4_ = 0x3c088908;
      auVar59._12_4_ = 0x3fb8aa3b;
      auVar55._12_4_ = 0x3f000000;
      auVar45._12_4_ = 0xc2b0c0a5;
      auVar36._12_4_ = 0x42b0c0a5;
      auVar30._12_4_ = 0x3ab743ce;
      auVar16._12_4_ = 0x395e8083;
      auVar63._16_4_ = 0x39506967;
      auVar60._16_4_ = 0x3c088908;
      auVar59._16_4_ = 0x3fb8aa3b;
      auVar55._16_4_ = 0x3f000000;
      auVar45._16_4_ = 0xc2b0c0a5;
      auVar36._16_4_ = 0x42b0c0a5;
      auVar30._16_4_ = 0x3ab743ce;
      auVar16._16_4_ = 0x395e8083;
      auVar63._20_4_ = 0x39506967;
      auVar60._20_4_ = 0x3c088908;
      auVar59._20_4_ = 0x3fb8aa3b;
      auVar55._20_4_ = 0x3f000000;
      auVar45._20_4_ = 0xc2b0c0a5;
      auVar36._20_4_ = 0x42b0c0a5;
      auVar30._20_4_ = 0x3ab743ce;
      auVar16._20_4_ = 0x395e8083;
      auVar63._24_4_ = 0x39506967;
      auVar60._24_4_ = 0x3c088908;
      auVar59._24_4_ = 0x3fb8aa3b;
      auVar55._24_4_ = 0x3f000000;
      auVar45._24_4_ = 0xc2b0c0a5;
      auVar36._24_4_ = 0x42b0c0a5;
      auVar30._24_4_ = 0x3ab743ce;
      auVar16._24_4_ = 0x395e8083;
      auVar63._28_4_ = 0x39506967;
      auVar60._28_4_ = 0x3c088908;
      auVar59._28_4_ = 0x3fb8aa3b;
      auVar55._28_4_ = 0x3f000000;
      auVar45._28_4_ = 0xc2b0c0a5;
      auVar36._28_4_ = 0x42b0c0a5;
      auVar30._28_4_ = 0x3ab743ce;
      auVar16._28_4_ = 0x395e8083;
      pauVar11 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar9 < 8) {
        uVar6 = 0;
      }
      else {
        iVar5 = 7;
        do {
          auVar17 = *pauVar11;
          auVar31._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
          auVar31._8_4_ = -auVar17._8_4_;
          auVar31._12_4_ = -auVar17._12_4_;
          auVar31._16_4_ = -auVar17._16_4_;
          auVar31._20_4_ = -auVar17._20_4_;
          auVar31._24_4_ = -auVar17._24_4_;
          auVar31._28_4_ = auVar17._28_4_ ^ 0x80000000;
          auVar31 = vminps_avx(auVar31,auVar36);
          auVar3 = vmaxps_avx(auVar31,auVar45);
          auVar33 = vfmadd213ps_fma(auVar59,auVar3,auVar55);
          auVar32 = vroundps_avx(ZEXT1632(auVar33),1);
          auVar31 = vcmpps_avx(ZEXT1632(auVar33),auVar32,1);
          auVar31 = vandps_avx(auVar57._0_32_,auVar31);
          auVar31 = vsubps_avx(auVar32,auVar31);
          auVar46._8_4_ = 0x3f318000;
          auVar46._0_8_ = 0x3f3180003f318000;
          auVar46._12_4_ = 0x3f318000;
          auVar46._16_4_ = 0x3f318000;
          auVar46._20_4_ = 0x3f318000;
          auVar46._24_4_ = 0x3f318000;
          auVar46._28_4_ = 0x3f318000;
          auVar33 = vfmsub231ps_fma(auVar3,auVar31,auVar46);
          auVar41 = vfmsub231ps_fma(ZEXT1632(auVar33),auVar31,auVar16);
          auVar32 = ZEXT1632(auVar41);
          auVar3._28_4_ = 0x3f318000;
          auVar3._0_28_ =
               ZEXT1628(CONCAT412(auVar41._12_4_ * auVar41._12_4_,
                                  CONCAT48(auVar41._8_4_ * auVar41._8_4_,
                                           CONCAT44(auVar41._4_4_ * auVar41._4_4_,
                                                    auVar41._0_4_ * auVar41._0_4_))));
          auVar33 = vfmadd213ps_fma(auVar63,auVar32,auVar30);
          auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar32,auVar60);
          auVar49._8_4_ = 0x3d2aa9c1;
          auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar49._12_4_ = 0x3d2aa9c1;
          auVar49._16_4_ = 0x3d2aa9c1;
          auVar49._20_4_ = 0x3d2aa9c1;
          auVar49._24_4_ = 0x3d2aa9c1;
          auVar49._28_4_ = 0x3d2aa9c1;
          auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar32,auVar49);
          auVar50._8_4_ = 0x3e2aaaaa;
          auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._12_4_ = 0x3e2aaaaa;
          auVar50._16_4_ = 0x3e2aaaaa;
          auVar50._20_4_ = 0x3e2aaaaa;
          auVar50._24_4_ = 0x3e2aaaaa;
          auVar50._28_4_ = 0x3e2aaaaa;
          auVar32 = ZEXT1632(auVar41);
          auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar32,auVar50);
          auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar32,auVar55);
          auVar33 = vfmadd213ps_fma(ZEXT1632(auVar33),auVar3,auVar32);
          auVar32._0_4_ = auVar57._0_4_ + auVar33._0_4_;
          auVar32._4_4_ = auVar57._4_4_ + auVar33._4_4_;
          auVar32._8_4_ = auVar57._8_4_ + auVar33._8_4_;
          auVar32._12_4_ = auVar57._12_4_ + auVar33._12_4_;
          auVar32._16_4_ = auVar57._16_4_ + 0.0;
          auVar32._20_4_ = auVar57._20_4_ + 0.0;
          auVar32._24_4_ = auVar57._24_4_ + 0.0;
          auVar32._28_4_ = auVar57._28_4_ + 0.0;
          auVar33._0_4_ = (int)auVar31._0_4_;
          auVar33._4_4_ = (int)auVar31._4_4_;
          auVar33._8_4_ = (int)auVar31._8_4_;
          auVar33._12_4_ = (int)auVar31._12_4_;
          auVar37._16_4_ = (int)auVar31._16_4_;
          auVar37._0_16_ = auVar33;
          auVar37._20_4_ = (int)auVar31._20_4_;
          auVar37._24_4_ = (int)auVar31._24_4_;
          auVar37._28_4_ = (int)auVar31._28_4_;
          auVar41 = vpslld_avx(auVar33,0x17);
          auVar33 = vpslld_avx(auVar37._16_16_,0x17);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar33 = vpaddd_avx(auVar33,auVar35);
          auVar41 = vpaddd_avx(auVar41,auVar35);
          auVar38._16_16_ = auVar33;
          auVar38._0_16_ = auVar41;
          auVar33 = vfmadd213ps_fma(auVar38,auVar32,auVar57._0_32_);
          auVar31 = vrcpps_avx(ZEXT1632(auVar33));
          auVar47._0_4_ = auVar17._0_4_ * auVar31._0_4_;
          auVar47._4_4_ = auVar17._4_4_ * auVar31._4_4_;
          auVar47._8_4_ = auVar17._8_4_ * auVar31._8_4_;
          auVar47._12_4_ = auVar17._12_4_ * auVar31._12_4_;
          auVar47._16_4_ = auVar17._16_4_ * auVar31._16_4_;
          auVar47._20_4_ = auVar17._20_4_ * auVar31._20_4_;
          auVar47._24_4_ = auVar17._24_4_ * auVar31._24_4_;
          auVar47._28_4_ = 0;
          auVar33 = vfmsub213ps_fma(ZEXT1632(auVar33),auVar47,auVar17);
          auVar33 = vfnmadd213ps_fma(ZEXT1632(auVar33),auVar31,auVar47);
          *pauVar11 = ZEXT1632(auVar33);
          pauVar11 = pauVar11 + 1;
          iVar5 = iVar5 + 8;
          uVar6 = uVar9 & 0xfffffff8;
        } while (iVar5 < (int)uVar9);
      }
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar54._8_4_ = 0x42b0c0a5;
      auVar54._0_8_ = 0x42b0c0a542b0c0a5;
      auVar54._12_4_ = 0x42b0c0a5;
      auVar56._8_4_ = 0xc2b0c0a5;
      auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar56._12_4_ = 0xc2b0c0a5;
      auVar58._8_4_ = 0x3fb8aa3b;
      auVar58._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar58._12_4_ = 0x3fb8aa3b;
      auVar26._8_4_ = 0x3f000000;
      auVar26._0_8_ = 0x3f0000003f000000;
      auVar26._12_4_ = 0x3f000000;
      auVar61._8_4_ = 0x3f318000;
      auVar61._0_8_ = 0x3f3180003f318000;
      auVar61._12_4_ = 0x3f318000;
      auVar62._8_4_ = 0x395e8083;
      auVar62._0_8_ = 0x395e8083395e8083;
      auVar62._12_4_ = 0x395e8083;
      auVar64._8_4_ = 0x3ab743ce;
      auVar64._0_8_ = 0x3ab743ce3ab743ce;
      auVar64._12_4_ = 0x3ab743ce;
      uVar8 = uVar6 | 3;
      while ((int)uVar8 < (int)uVar9) {
        auVar33 = *(undefined1 (*) [16])*pauVar11;
        auVar27._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
        auVar27._8_4_ = -auVar33._8_4_;
        auVar27._12_4_ = -auVar33._12_4_;
        auVar35 = vminps_avx(auVar54,auVar27);
        auVar28 = vmaxps_avx(auVar56,auVar35);
        auVar35 = vfmadd213ps_fma(auVar58,auVar28,auVar26);
        auVar42._0_4_ = (int)auVar35._0_4_;
        auVar42._4_4_ = (int)auVar35._4_4_;
        auVar42._8_4_ = (int)auVar35._8_4_;
        auVar42._12_4_ = (int)auVar35._12_4_;
        auVar27 = vcvtdq2ps_avx(auVar42);
        auVar35 = vcmpps_avx(auVar35,auVar27,1);
        auVar35 = vandps_avx(auVar35,auVar41);
        auVar35 = vsubps_avx(auVar27,auVar35);
        auVar27 = vfmsub231ps_fma(auVar28,auVar35,auVar61);
        auVar28 = vfmsub231ps_fma(auVar27,auVar35,auVar62);
        auVar43._0_4_ = auVar28._0_4_ * auVar28._0_4_;
        auVar43._4_4_ = auVar28._4_4_ * auVar28._4_4_;
        auVar43._8_4_ = auVar28._8_4_ * auVar28._8_4_;
        auVar43._12_4_ = auVar28._12_4_ * auVar28._12_4_;
        auVar48._8_4_ = 0x39506967;
        auVar48._0_8_ = 0x3950696739506967;
        auVar48._12_4_ = 0x39506967;
        auVar27 = vfmadd213ps_fma(auVar48,auVar28,auVar64);
        auVar51._8_4_ = 0x3c088908;
        auVar51._0_8_ = 0x3c0889083c088908;
        auVar51._12_4_ = 0x3c088908;
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar51);
        auVar52._8_4_ = 0x3d2aa9c1;
        auVar52._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar52._12_4_ = 0x3d2aa9c1;
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar52);
        auVar53._8_4_ = 0x3e2aaaaa;
        auVar53._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar53._12_4_ = 0x3e2aaaaa;
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar53);
        auVar27 = vfmadd213ps_fma(auVar27,auVar28,auVar26);
        auVar27 = vfmadd213ps_fma(auVar27,auVar43,auVar28);
        auVar28._0_4_ = auVar27._0_4_ + 1.0;
        auVar28._4_4_ = auVar27._4_4_ + 1.0;
        auVar28._8_4_ = auVar27._8_4_ + 1.0;
        auVar28._12_4_ = auVar27._12_4_ + 1.0;
        auVar34._0_4_ = (int)auVar35._0_4_;
        auVar34._4_4_ = (int)auVar35._4_4_;
        auVar34._8_4_ = (int)auVar35._8_4_;
        auVar34._12_4_ = (int)auVar35._12_4_;
        auVar35 = vpslld_avx(auVar34,0x17);
        auVar35 = vpaddd_avx(auVar35,auVar41);
        auVar27 = vfmadd213ps_fma(auVar35,auVar28,auVar41);
        auVar35 = vrcpps_avx(auVar27);
        auVar44._0_4_ = auVar33._0_4_ * auVar35._0_4_;
        auVar44._4_4_ = auVar33._4_4_ * auVar35._4_4_;
        auVar44._8_4_ = auVar33._8_4_ * auVar35._8_4_;
        auVar44._12_4_ = auVar33._12_4_ * auVar35._12_4_;
        auVar33 = vfmsub213ps_fma(auVar27,auVar44,auVar33);
        auVar33 = vfnmadd213ps_fma(auVar33,auVar35,auVar44);
        *(undefined1 (*) [16])*pauVar11 = auVar33;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        uVar8 = uVar6 + 7;
        uVar6 = uVar6 + 4;
      }
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar33 = vpcmpeqd_avx(auVar41,auVar41);
      if ((int)uVar6 < (int)uVar9) {
        uVar7 = CONCAT44(0,~uVar6 + uVar9);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar7;
        auVar54 = vpshufd_avx(auVar13,0x44);
        auVar41 = vpor_avx(auVar54,auVar4);
        auVar35 = vpor_avx(auVar54,auVar4);
        uVar12 = 0;
        auVar16 = _DAT_00550960;
        do {
          auVar1._8_8_ = 0x8000000000000000;
          auVar1._0_8_ = 0x8000000000000000;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar12;
          auVar56 = vpshufd_avx(auVar14,0x44);
          auVar17._16_16_ = auVar56;
          auVar17._0_16_ = auVar56;
          auVar30 = vorps_avx(auVar17,_DAT_00550940);
          auVar16 = vorps_avx(auVar17,auVar16);
          auVar26 = vpor_avx(auVar54,auVar1);
          auVar56 = vpcmpgtq_avx(auVar16._16_16_ ^ auVar1,auVar26);
          auVar58 = vpcmpgtq_avx(auVar16._0_16_ ^ auVar1,auVar41);
          auVar56 = vpackssdw_avx(auVar58,auVar56);
          auVar58 = vpcmpgtq_avx(auVar30._16_16_ ^ auVar1,auVar26);
          auVar29._0_8_ = auVar30._0_8_ ^ 0x8000000000000000;
          auVar29._8_4_ = auVar30._8_4_;
          auVar29._12_4_ = auVar30._12_4_ ^ 0x80000000;
          auVar26 = vpcmpgtq_avx(auVar29,auVar35);
          auVar58 = vpackssdw_avx(auVar26,auVar58);
          auVar56 = vpackssdw_avx(auVar58 ^ auVar33,auVar56 ^ auVar33);
          auVar58 = vpmovsxwd_avx(auVar56);
          auVar56 = vpunpckhwd_avx(auVar56,auVar56);
          auVar18._16_16_ = auVar56;
          auVar18._0_16_ = auVar58;
          auVar36 = vmaskmovps_avx(auVar18,*(undefined1 (*) [32])(*pauVar11 + uVar12 * 4));
          auVar15._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
          auVar15._8_4_ = -auVar36._8_4_;
          auVar15._12_4_ = -auVar36._12_4_;
          auVar19._16_4_ = -auVar36._16_4_;
          auVar19._0_16_ = auVar15;
          auVar19._20_4_ = -auVar36._20_4_;
          auVar19._24_4_ = -auVar36._24_4_;
          auVar19._28_4_ = auVar36._28_4_ ^ 0x80000000;
          auVar26 = auVar19._16_16_;
          local_128._0_4_ = expf(auVar19._16_4_);
          local_128._4_4_ = extraout_XMM0_Db;
          local_128._8_4_ = extraout_XMM0_Dc;
          local_128._12_4_ = extraout_XMM0_Dd;
          auVar56 = vpermilps_avx(auVar26,0xf5);
          auVar57._0_4_ = expf(auVar56._0_4_);
          auVar57._4_60_ = extraout_var;
          auVar56 = vinsertps_avx(local_128,auVar57._0_16_,0x10);
          auVar58 = vpermilps_avx(auVar26,0x4e);
          auVar21._0_4_ = expf(auVar58._0_4_);
          auVar21._4_60_ = extraout_var_00;
          auVar56 = vinsertps_avx(auVar56,auVar21._0_16_,0x20);
          auVar58 = vpermilps_avx(auVar26,0xff);
          auVar22._0_4_ = expf(auVar58._0_4_);
          auVar22._4_60_ = extraout_var_01;
          auVar56 = vinsertps_avx(auVar56,auVar22._0_16_,0x30);
          local_d8 = (float)auVar15._0_8_;
          auVar40 = (undefined1  [36])0x0;
          local_128._0_4_ = expf(local_d8);
          local_128._4_4_ = extraout_XMM0_Db_00;
          local_128._8_4_ = extraout_XMM0_Dc_00;
          local_128._12_4_ = extraout_XMM0_Dd_00;
          auVar58 = vpermilps_avx(auVar15,0xf5);
          auVar23._0_4_ = expf(auVar58._0_4_);
          auVar23._4_60_ = extraout_var_02;
          auVar58 = vinsertps_avx(local_128,auVar23._0_16_,0x10);
          auVar26 = vpermilps_avx(auVar15,0x4e);
          auVar24._0_4_ = expf(auVar26._0_4_);
          auVar24._4_60_ = extraout_var_03;
          auVar58 = vinsertps_avx(auVar58,auVar24._0_16_,0x20);
          auVar26 = vpermilps_avx(auVar15,0xff);
          auVar25._0_4_ = expf(auVar26._0_4_);
          auVar16 = _DAT_00550960;
          auVar25._4_60_ = extraout_var_04;
          auVar33 = vpcmpeqd_avx(auVar33,auVar33);
          auVar57 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar58 = vinsertps_avx(auVar58,auVar25._0_16_,0x30);
          auVar20._0_4_ = auVar58._0_4_ + 1.0;
          auVar20._4_4_ = auVar58._4_4_ + 1.0;
          auVar20._8_4_ = auVar58._8_4_ + 1.0;
          auVar20._12_4_ = auVar58._12_4_ + 1.0;
          auVar20._16_4_ = auVar56._0_4_ + 1.0;
          auVar20._20_4_ = auVar56._4_4_ + 1.0;
          auVar20._24_4_ = auVar56._8_4_ + 1.0;
          auVar20._28_4_ = auVar56._12_4_ + 1.0;
          auVar30 = vrcpps_avx(auVar20);
          auVar39._0_4_ = auVar36._0_4_ * auVar30._0_4_;
          auVar39._4_4_ = auVar36._4_4_ * auVar30._4_4_;
          auVar39._8_4_ = auVar36._8_4_ * auVar30._8_4_;
          auVar39._12_4_ = auVar36._12_4_ * auVar30._12_4_;
          auVar39._16_4_ = auVar36._16_4_ * auVar30._16_4_;
          auVar39._20_4_ = auVar36._20_4_ * auVar30._20_4_;
          auVar39._24_4_ = auVar36._24_4_ * auVar30._24_4_;
          auVar39._28_36_ = auVar40;
          auVar56 = vfmsub213ps_fma(auVar20,auVar39._0_32_,auVar36);
          auVar56 = vfnmadd213ps_fma(ZEXT1632(auVar56),auVar30,auVar39._0_32_);
          auVar30 = vmaskmovps_avx(auVar18,ZEXT1632(auVar56));
          *(undefined1 (*) [32])(*pauVar11 + uVar12 * 4) = auVar30;
          uVar12 = uVar12 + 8;
        } while ((uVar7 + 8 & 0xfffffffffffffff8) != uVar12);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int Swish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}